

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_lib.c
# Opt level: O1

int bn_cmp_words(unsigned_long *a,unsigned_long *b,int n)

{
  ulong uVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar1 = a[(long)n + -1];
  uVar4 = b[(long)n + -1];
  if (uVar1 == uVar4) {
    if (1 < n) {
      uVar3 = (ulong)(n - 1);
      do {
        uVar2 = (int)uVar3 - 1;
        uVar3 = (ulong)uVar2;
        uVar1 = a[uVar3];
        uVar4 = b[uVar3];
        if (uVar1 != uVar4) goto LAB_00112cdc;
      } while (0 < (int)uVar2);
    }
    return 0;
  }
LAB_00112cdc:
  return (uVar4 < uVar1) - 1 | 1;
}

Assistant:

int bn_cmp_words(const BN_ULONG *a, const BN_ULONG *b, int n)
{
    int i;
    BN_ULONG aa, bb;

    aa = a[n - 1];
    bb = b[n - 1];
    if (aa != bb)
        return ((aa > bb) ? 1 : -1);
    for (i = n - 2; i >= 0; i--) {
        aa = a[i];
        bb = b[i];
        if (aa != bb)
            return ((aa > bb) ? 1 : -1);
    }
    return (0);
}